

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O3

JavascriptString * __thiscall Js::CharStringCache::GetStringForChar(CharStringCache *this,char16 c)

{
  char c_00;
  JavascriptString *pJVar1;
  
  StringProfiler::RecordSingleCharStringRequest
            ((ScriptContext *)this[-5].charStringCacheA[0x73].ptr);
  if ((ushort)c < 0x80) {
    c_00 = JavascriptString::ToASCII7BitChar(c);
    pJVar1 = GetStringForCharA(this,c_00);
    return pJVar1;
  }
  pJVar1 = GetStringForCharW(this,c);
  return pJVar1;
}

Assistant:

JavascriptString* CharStringCache::GetStringForChar(char16 c)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(GetStringForChar);
#ifdef PROFILE_STRINGS
        StringProfiler::RecordSingleCharStringRequest(JavascriptLibrary::FromCharStringCache(this)->GetScriptContext());
#endif
        if (JavascriptString::IsASCII7BitChar(c))
        {
            return GetStringForCharA(JavascriptString::ToASCII7BitChar(c));
        }

        return GetStringForCharW(c);
        JIT_HELPER_END(GetStringForChar);
    }